

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-example.cc
# Opt level: O0

string * __thiscall
ExprPrinter::format<std::__cxx11::string>
          (ExprPrinter *this,char *format_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicWriter<char> *this_00;
  BasicWriter<char> *this_01;
  char *in_RDX;
  long in_RSI;
  string *in_RDI;
  string *id;
  undefined7 in_stack_ffffffffffffff58;
  char in_stack_ffffffffffffff5f;
  BasicStringRef<char> *in_stack_ffffffffffffff60;
  string *args_00;
  BasicCStringRef<char> in_stack_ffffffffffffff90;
  CStringRef in_stack_ffffffffffffff98;
  BasicCStringRef<char> local_30;
  undefined1 local_21;
  char *local_18;
  
  local_21 = 0;
  args_00 = in_RDI;
  local_18 = in_RDX;
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_30,"e{}");
  *(int *)(in_RSI + 8) = *(int *)(in_RSI + 8) + 1;
  fmt::format<int>(in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90.data_);
  this_00 = (BasicWriter<char> *)(in_RSI + 0x10);
  fmt::BasicStringRef<char>::BasicStringRef
            (in_stack_ffffffffffffff60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  value.size_ = (size_t)in_stack_ffffffffffffff90.data_;
  value.data_ = (char *)this_00;
  fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)args_00,value);
  fmt::BasicStringRef<char>::BasicStringRef
            (in_stack_ffffffffffffff60,
             (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  value_00.size_ = (size_t)in_stack_ffffffffffffff90.data_;
  value_00.data_ = (char *)this_00;
  fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)args_00,value_00);
  this_01 = (BasicWriter<char> *)(in_RSI + 0x10);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffff90,local_18);
  fmt::BasicWriter<char>::write<std::__cxx11::string>(this_00,in_stack_ffffffffffffff90,args_00);
  fmt::BasicWriter<char>::operator<<(this_01,in_stack_ffffffffffffff5f);
  return in_RDI;
}

Assistant:

std::string format(const char *format_str, const T &... args) {
    std::string id = fmt::format("e{}", next_expr_id_++);
    output_ << id << " = ";
    output_.write(format_str, args...);
    output_ << '\n';
    return id;
  }